

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_make_vector_op(sexp ctx,sexp self,sexp_sint_t n,sexp len,sexp dflt)

{
  sexp psVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((sexp)&DAT_00000001 < len) {
    uVar3 = (long)len >> 1;
    if (uVar3 >> 0x3d != 0) {
      psVar1 = sexp_xtype_exception(ctx,self,"vector length out of range",len);
      return psVar1;
    }
    psVar1 = sexp_alloc_tagged_aux(ctx,uVar3 * 8 + 0x10,10);
    if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
      for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        *(sexp *)((long)&psVar1->value + uVar2 * 8 + 8) = dflt;
      }
      (psVar1->value).stack.length = uVar3;
    }
  }
  else {
    psVar1 = (sexp)(((ctx->value).type.setters)->value).context.mark_stack[2].prev;
  }
  return psVar1;
}

Assistant:

sexp sexp_make_vector_op (sexp ctx, sexp self, sexp_sint_t n, sexp len, sexp dflt) {
  sexp vec, *x;
  sexp_sint_t i, clen = sexp_unbox_fixnum(len);
  if (! clen) return sexp_global(ctx, SEXP_G_EMPTY_VECTOR);
  if (clen < 0 || clen > SEXP_MAX_VECTOR_LENGTH)
    return sexp_xtype_exception(ctx, self, "vector length out of range", len);
  vec = sexp_alloc_tagged(ctx, sexp_sizeof(vector) + clen*sizeof(sexp),
                          SEXP_VECTOR);
  if (sexp_exceptionp(vec)) return vec;
  x = sexp_vector_data(vec);
  for (i=0; i<clen; i++)
    x[i] = dflt;
  sexp_vector_length(vec) = clen;
  return vec;
}